

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaO_chunkid(char *out,char *source,size_t bufflen)

{
  size_t sVar1;
  size_t local_30;
  size_t len;
  size_t l;
  size_t bufflen_local;
  char *source_local;
  char *out_local;
  
  if (*source == '=') {
    strncpy(out,source + 1,bufflen);
    out[bufflen - 1] = '\0';
  }
  else if (*source == '@') {
    bufflen_local = (size_t)(source + 1);
    sVar1 = strlen((char *)bufflen_local);
    strcpy(out,"");
    if (bufflen - 8 < sVar1) {
      bufflen_local = bufflen_local + (sVar1 - (bufflen - 8));
      strcat(out,"...");
    }
    strcat(out,(char *)bufflen_local);
  }
  else {
    local_30 = strcspn(source,"\n\r");
    if (bufflen - 0x11 < local_30) {
      local_30 = bufflen - 0x11;
    }
    strcpy(out,"[string \"");
    if (source[local_30] == '\0') {
      strcat(out,source);
    }
    else {
      strncat(out,source,local_30);
      strcat(out,"...");
    }
    strcat(out,"\"]");
  }
  return;
}

Assistant:

static void luaO_chunkid(char*out,const char*source,size_t bufflen){
if(*source=='='){
strncpy(out,source+1,bufflen);
out[bufflen-1]='\0';
}
else{
if(*source=='@'){
size_t l;
source++;
bufflen-=sizeof(" '...' ");
l=strlen(source);
strcpy(out,"");
if(l>bufflen){
source+=(l-bufflen);
strcat(out,"...");
}
strcat(out,source);
}
else{
size_t len=strcspn(source,"\n\r");
bufflen-=sizeof(" [string \"...\"] ");
if(len>bufflen)len=bufflen;
strcpy(out,"[string \"");
if(source[len]!='\0'){
strncat(out,source,len);
strcat(out,"...");
}
else
strcat(out,source);
strcat(out,"\"]");
}
}
}